

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

JavascriptMethod __thiscall
Js::FunctionBody::EnsureDynamicInterpreterThunk
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptMethod p_Var6;
  ScriptContext *this_00;
  ThreadContext *this_01;
  BackgroundJobProcessor *this_02;
  CriticalSection *cs;
  ProxyEntryPointInfo *pPVar7;
  AutoCriticalSection local_30;
  AutoCriticalSection autocs;
  BackgroundJobProcessor *backgroundJobProcessor;
  JobProcessor *jobProcessor;
  FunctionEntryPointInfo *entryPointInfo_local;
  FunctionBody *this_local;
  
  EnsureDynamicProfileInfo(this);
  bVar2 = FunctionProxy::HasValidEntryPoint((FunctionProxy *)this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xf21,"(HasValidEntryPoint())","HasValidEntryPoint()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((*(ushort *)&(this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 0xb & 1)
       != 0) && (uVar3 = GetByteCodeCount(this), uVar3 == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xf22,"(!m_isWasmFunction || GetByteCodeCount() > 0)",
                                "Wasm function should be parsed by this point");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  p_Var6 = GetEntryPoint(this,(ProxyEntryPointInfo *)entryPointInfo);
  bVar2 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var6);
  if (bVar2) {
    p_Var6 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
    bVar2 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var6);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xf26,
                                  "(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))"
                                  ,
                                  "InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked())"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    GenerateDynamicInterpreterThunk(this);
    p_Var6 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
    ParseableFunctionInfo::SetEntryPoint
              (&this->super_ParseableFunctionInfo,(ProxyEntryPointInfo *)entryPointInfo,p_Var6);
  }
  else {
    p_Var6 = GetEntryPoint(this,(ProxyEntryPointInfo *)entryPointInfo);
    if (p_Var6 == ScriptContext::DebugProfileProbeThunk) {
      p_Var6 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
      bVar2 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var6);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xf2e,
                                    "(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))"
                                    ,
                                    "InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked())"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      GenerateDynamicInterpreterThunk(this);
    }
    else {
      p_Var6 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
      bVar2 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var6);
      if (bVar2) {
        this_00 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
        this_01 = ScriptContext::GetThreadContext(this_00);
        this_02 = (BackgroundJobProcessor *)ThreadContext::GetJobProcessor(this_01);
        bVar2 = JsUtil::JobProcessor::ProcessesInBackground((JobProcessor *)this_02);
        if (bVar2) {
          autocs.cs = (CriticalSection *)this_02;
          cs = JsUtil::BackgroundJobProcessor::GetCriticalSection(this_02);
          AutoCriticalSection::AutoCriticalSection(&local_30,cs);
          p_Var6 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
          bVar2 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var6);
          if (bVar2) {
            pPVar7 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
            p_Var6 = GetEntryPoint(this,pPVar7);
            BVar4 = IsIntermediateCodeGenThunk(p_Var6);
            if (BVar4 == 0) {
              pPVar7 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
              p_Var6 = GetEntryPoint(this,pPVar7);
              BVar4 = IsAsmJsCodeGenThunk(p_Var6);
              if (BVar4 == 0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar5 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                            ,0xf3d,
                                            "(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())))"
                                            ,
                                            "IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo()))"
                                           );
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar5 = 0;
              }
            }
            GenerateDynamicInterpreterThunk(this);
          }
          AutoCriticalSection::~AutoCriticalSection(&local_30);
        }
        else {
          pPVar7 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
          p_Var6 = GetEntryPoint(this,pPVar7);
          BVar4 = IsIntermediateCodeGenThunk(p_Var6);
          if (BVar4 == 0) {
            pPVar7 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
            p_Var6 = GetEntryPoint(this,pPVar7);
            BVar4 = IsAsmJsCodeGenThunk(p_Var6);
            if (BVar4 == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                          ,0xf45,
                                          "(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())))"
                                          ,
                                          "IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo()))"
                                         );
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
          }
          GenerateDynamicInterpreterThunk(this);
        }
      }
    }
  }
  p_Var6 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
  return p_Var6;
}

Assistant:

JavascriptMethod FunctionBody::EnsureDynamicInterpreterThunk(FunctionEntryPointInfo* entryPointInfo)
    {
        // This may be first call to the function, make sure we have dynamic profile info
        //
        // We need to ensure dynamic profile info even if we didn't generate a dynamic interpreter thunk
        // This happens when we go through CheckCodeGen thunk, to DelayDynamicInterpreterThunk, to here
        // but the background codegen thread updated the entry point with the native entry point.
        this->EnsureDynamicProfileInfo();

        Assert(HasValidEntryPoint());
        AssertMsg(!m_isWasmFunction || GetByteCodeCount() > 0, "Wasm function should be parsed by this point");
        if (InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetEntryPoint(entryPointInfo)))
        {
            // We are not doing code gen on this function, just change the entry point directly
            Assert(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()));
            GenerateDynamicInterpreterThunk();
            this->SetEntryPoint(entryPointInfo, this->GetOriginalEntryPoint_Unchecked());
        }
        else if (this->GetEntryPoint(entryPointInfo) == ProfileEntryThunk)
        {
            // We are not doing codegen on this function, just change the entry point directly
            // Don't replace the profile entry thunk
            Assert(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()));
            GenerateDynamicInterpreterThunk();
        }
        else if (InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))
        {
            JsUtil::JobProcessor * jobProcessor = this->GetScriptContext()->GetThreadContext()->GetJobProcessor();
            if (jobProcessor->ProcessesInBackground())
            {
                JsUtil::BackgroundJobProcessor * backgroundJobProcessor = static_cast<JsUtil::BackgroundJobProcessor *>(jobProcessor);
                AutoCriticalSection autocs(backgroundJobProcessor->GetCriticalSection());
                // Check again under lock
                if (InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))
                {
                    // If the original entry point is DelayDynamicInterpreterThunk then there must be a version of this
                    // function being codegen'd.
                    Assert(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())));
                    GenerateDynamicInterpreterThunk();
                }
            }
            else
            {
                // If the original entry point is DelayDynamicInterpreterThunk then there must be a version of this
                // function being codegen'd.
                Assert(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())));
                GenerateDynamicInterpreterThunk();
            }
        }
        return this->GetOriginalEntryPoint_Unchecked();
    }